

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::AddP70vector(Node *this,string *name,double x,double y,double z)

{
  Node n;
  allocator<char> local_d9;
  double local_d8;
  double local_d0;
  double local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  Node local_80;
  
  local_d8 = x;
  local_d0 = y;
  local_c8 = z;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"P",&local_d9);
  Node(&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,(string *)name);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,double,double,double>
            (&local_80,&local_c0,"Vector3D","Vector","",local_d8,local_d0,local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_80);
  ~Node(&local_80);
  return;
}

Assistant:

void FBX::Node::AddP70vector(
    const std::string& name, double x, double y, double z
) {
    FBX::Node n("P");
    n.AddProperties(name, "Vector3D", "Vector", "", x, y, z);
    AddChild(n);
}